

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O3

lc_funcdefs * funcdef_new(long addr,char *name)

{
  lc_funcdefs *plVar1;
  char *pcVar2;
  
  plVar1 = (lc_funcdefs *)calloc(1,0x30);
  plVar1->addr = addr;
  pcVar2 = strdup(name);
  plVar1->name = pcVar2;
  return plVar1;
}

Assistant:

struct lc_funcdefs *funcdef_new(long addr, char *name)
{
	struct lc_funcdefs *f = New(struct lc_funcdefs);
	if (!f) {
	    lc_error("Could not alloc function definition for '%s'.", name);
	    return NULL;
	}
	f->next = NULL;
	f->addr = addr;
	f->name = strdup(name);
	f->n_called = 0;
	f->code.opcodes = NULL;
	f->code.n_opcodes = 0;
	return f;
}